

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# enter.hpp
# Opt level: O0

void __thiscall
soplex::
SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
::computeCoTest(SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                *this)

{
  bool bVar1;
  type_conflict5 tVar2;
  int iVar3;
  Verbosity VVar4;
  int *piVar5;
  streamsize sVar6;
  cpp_dec_float<50U,_int,_void> *this_00;
  SPxOut *i_00;
  cpp_dec_float<50U,_int,_void> *this_01;
  long in_RDI;
  streamsize prec;
  Verbosity old_verbosity_1;
  Verbosity old_verbosity;
  Status stat;
  Desc *ds;
  int sparsitythreshold;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  pricingTol;
  int i;
  scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_false>
  precision_guard_2;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *result_2;
  scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_false>
  precision_guard_1;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *result_1;
  scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_false>
  precision_guard;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *result;
  scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_false>
  precision_guard_3;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *result_3;
  undefined4 in_stack_fffffffffffffc88;
  Status in_stack_fffffffffffffc8c;
  SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *in_stack_fffffffffffffc90;
  SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *in_stack_fffffffffffffca8;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *in_stack_fffffffffffffcb0;
  int local_328;
  int local_324;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_320;
  undefined1 local_2e8 [48];
  Status in_stack_fffffffffffffd48;
  int in_stack_fffffffffffffd4c;
  undefined4 in_stack_fffffffffffffd50;
  undefined4 in_stack_fffffffffffffd54;
  undefined4 local_2a0;
  Verbosity local_29c;
  undefined1 local_298 [56];
  undefined4 local_260;
  Verbosity local_25c;
  undefined1 local_258 [56];
  undefined1 local_220 [56];
  undefined4 local_1e8;
  Status local_1e4;
  Desc *local_1e0;
  int local_1d8;
  undefined1 local_1d4 [56];
  int local_19c;
  undefined4 local_198;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_194;
  int local_15c;
  undefined8 local_150;
  int *local_148;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_140;
  undefined4 *local_138;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_130;
  undefined4 *local_128;
  long local_120;
  undefined1 *local_118;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_110;
  undefined4 *local_108;
  undefined4 *local_100;
  int *local_f8;
  scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>,false>
  local_e9;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_e8;
  undefined1 *local_e0;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_d8;
  undefined1 *local_d0;
  undefined1 *local_c8;
  scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>,false>
  local_b9;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_b8;
  undefined1 *local_b0;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_a8;
  undefined1 *local_a0;
  undefined1 *local_98;
  long local_90;
  scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>,false>
  local_81;
  int *local_80;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_78;
  undefined1 *local_70;
  undefined1 *local_68;
  int *local_60;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_58;
  undefined1 *local_50;
  long local_48;
  scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>,false>
  local_39;
  int *local_38;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_30;
  undefined1 *local_28;
  undefined1 *local_20;
  int *local_18;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_10;
  undefined1 *local_8;
  
  leavetol(in_stack_fffffffffffffca8);
  *(undefined1 *)(in_RDI + 0x4f4) = 1;
  local_198 = 0;
  local_120 = in_RDI + 0x4bc;
  local_128 = &local_198;
  local_108 = local_128;
  boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator=
            ((cpp_dec_float<50U,_int,_void> *)in_stack_fffffffffffffc90,
             CONCAT44(in_stack_fffffffffffffc8c,in_stack_fffffffffffffc88));
  *(undefined4 *)(in_RDI + 0x534) = 0;
  IdxSet::clear((IdxSet *)(in_RDI + 0xc78));
  local_1d8 = dim((SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                   *)0x35e119);
  local_70 = local_1d4;
  local_80 = &local_1d8;
  local_78 = (number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
              *)(in_RDI + 0x6fc);
  boost::multiprecision::detail::
  scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>,false>
  ::
  scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>>
            (&local_81,
             (number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
              *)(in_RDI + 0x6fc));
  local_68 = local_1d4;
  boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::cpp_dec_float
            ((cpp_dec_float<50U,_int,_void> *)in_stack_fffffffffffffc90);
  local_50 = local_1d4;
  local_58 = local_78;
  local_60 = local_80;
  local_90 = (long)*local_80;
  boost::multiprecision::default_ops::
  eval_multiply<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,boost::multiprecision::backends::cpp_dec_float<50u,int,void>,long_long>
            ((cpp_dec_float<50U,_int,_void> *)in_stack_fffffffffffffc90,
             (cpp_dec_float<50U,_int,_void> *)
             CONCAT44(in_stack_fffffffffffffc8c,in_stack_fffffffffffffc88),(longlong *)0x35e1e1);
  local_19c = boost::multiprecision::number::operator_cast_to_int
                        ((number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                          *)0x35e1ee);
  local_1e0 = SPxBasisBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
              ::desc((SPxBasisBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                      *)(in_RDI + 0x1f0));
  local_15c = dim((SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                   *)0x35e218);
  while (local_15c = local_15c + -1, -1 < local_15c) {
    local_1e4 = SPxBasisBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                ::Desc::coStatus((Desc *)in_stack_fffffffffffffc90,in_stack_fffffffffffffc8c);
    bVar1 = isBasic(in_stack_fffffffffffffc90,in_stack_fffffffffffffc8c);
    if (bVar1) {
      local_1e8 = 0;
      local_130 = VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                  ::operator[]((VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                *)in_stack_fffffffffffffc90,in_stack_fffffffffffffc8c);
      local_138 = &local_1e8;
      local_100 = local_138;
      boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator=
                ((cpp_dec_float<50U,_int,_void> *)in_stack_fffffffffffffc90,
                 CONCAT44(in_stack_fffffffffffffc8c,in_stack_fffffffffffffc88));
      if (*(int *)(in_RDI + 0xd34) == 0) {
        piVar5 = DataArray<int>::operator[]((DataArray<int> *)(in_RDI + 0xcf8),local_15c);
        *piVar5 = 0;
      }
    }
    else {
      coTest((SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
              *)CONCAT44(in_stack_fffffffffffffd54,in_stack_fffffffffffffd50),
             in_stack_fffffffffffffd4c,in_stack_fffffffffffffd48);
      local_110 = VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                  ::operator[]((VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                *)in_stack_fffffffffffffc90,in_stack_fffffffffffffc8c);
      local_118 = local_220;
      boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator=
                ((cpp_dec_float<50U,_int,_void> *)in_stack_fffffffffffffc90,
                 (cpp_dec_float<50U,_int,_void> *)
                 CONCAT44(in_stack_fffffffffffffc8c,in_stack_fffffffffffffc88));
      if (*(int *)(in_RDI + 0xd34) == 0) {
        VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
        ::operator[]((VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                      *)in_stack_fffffffffffffc90,in_stack_fffffffffffffc8c);
        local_b0 = local_258;
        local_b8 = &local_194;
        boost::multiprecision::detail::
        scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>,false>
        ::
        scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>>
                  (&local_b9,local_b8);
        local_a0 = local_258;
        local_a8 = local_b8;
        boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::cpp_dec_float
                  ((cpp_dec_float<50U,_int,_void> *)in_stack_fffffffffffffc90,
                   (cpp_dec_float<50U,_int,_void> *)
                   CONCAT44(in_stack_fffffffffffffc8c,in_stack_fffffffffffffc88));
        local_98 = local_258;
        boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::negate
                  ((cpp_dec_float<50U,_int,_void> *)in_stack_fffffffffffffc90);
        tVar2 = boost::multiprecision::operator<
                          ((number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                            *)CONCAT44(in_stack_fffffffffffffc8c,in_stack_fffffffffffffc88),
                           (number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                            *)0x35e426);
        if (tVar2) {
          VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
          ::operator[]((VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                        *)in_stack_fffffffffffffc90,in_stack_fffffffffffffc8c);
          boost::multiprecision::
          number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
          ::operator-=(in_stack_fffffffffffffcb0,(self_type *)in_stack_fffffffffffffca8);
          DIdxSet::addIdx((DIdxSet *)in_stack_fffffffffffffc90,in_stack_fffffffffffffc8c);
          piVar5 = DataArray<int>::operator[]((DataArray<int> *)(in_RDI + 0xcf8),local_15c);
          *piVar5 = 1;
          *(int *)(in_RDI + 0x534) = *(int *)(in_RDI + 0x534) + 1;
        }
        else {
          piVar5 = DataArray<int>::operator[]((DataArray<int> *)(in_RDI + 0xcf8),local_15c);
          *piVar5 = 0;
        }
        iVar3 = IdxSet::size((IdxSet *)(in_RDI + 0xc78));
        if (local_19c < iVar3) {
          if ((*(long *)(in_RDI + 0xda8) != 0) &&
             (VVar4 = SPxOut::getVerbosity(*(SPxOut **)(in_RDI + 0xda8)), 3 < (int)VVar4)) {
            local_25c = SPxOut::getVerbosity(*(SPxOut **)(in_RDI + 0xda8));
            local_260 = 4;
            (**(code **)(**(long **)(in_RDI + 0xda8) + 0x10))(*(long **)(in_RDI + 0xda8),&local_260)
            ;
            soplex::operator<<((SPxOut *)in_stack_fffffffffffffc90,
                               (char *)CONCAT44(in_stack_fffffffffffffc8c,in_stack_fffffffffffffc88)
                              );
            soplex::operator<<((SPxOut *)in_stack_fffffffffffffc90,
                               (_func_ostream_ptr_ostream_ptr *)
                               CONCAT44(in_stack_fffffffffffffc8c,in_stack_fffffffffffffc88));
            (**(code **)(**(long **)(in_RDI + 0xda8) + 0x10))(*(long **)(in_RDI + 0xda8),&local_25c)
            ;
          }
          *(undefined4 *)(in_RDI + 0xd34) = 5;
          *(undefined1 *)(in_RDI + 0xd29) = 0;
          IdxSet::clear((IdxSet *)(in_RDI + 0xc78));
        }
      }
      else {
        in_stack_fffffffffffffcb0 =
             VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
             ::operator[]((VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                           *)in_stack_fffffffffffffc90,in_stack_fffffffffffffc8c);
        local_e0 = local_298;
        local_e8 = &local_194;
        boost::multiprecision::detail::
        scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>,false>
        ::
        scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>>
                  (&local_e9,local_e8);
        local_d0 = local_298;
        local_d8 = local_e8;
        boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::cpp_dec_float
                  ((cpp_dec_float<50U,_int,_void> *)in_stack_fffffffffffffc90,
                   (cpp_dec_float<50U,_int,_void> *)
                   CONCAT44(in_stack_fffffffffffffc8c,in_stack_fffffffffffffc88));
        local_c8 = local_298;
        boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::negate
                  ((cpp_dec_float<50U,_int,_void> *)in_stack_fffffffffffffc90);
        tVar2 = boost::multiprecision::operator<
                          ((number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                            *)CONCAT44(in_stack_fffffffffffffc8c,in_stack_fffffffffffffc88),
                           (number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                            *)0x35e675);
        if (tVar2) {
          VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
          ::operator[]((VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                        *)in_stack_fffffffffffffc90,in_stack_fffffffffffffc8c);
          boost::multiprecision::
          number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
          ::operator-=(in_stack_fffffffffffffcb0,(self_type *)in_stack_fffffffffffffca8);
          *(int *)(in_RDI + 0x534) = *(int *)(in_RDI + 0x534) + 1;
        }
      }
    }
  }
  iVar3 = IdxSet::size((IdxSet *)(in_RDI + 0xc78));
  if ((iVar3 == 0) && ((*(byte *)(in_RDI + 0xd29) & 1) == 0)) {
    *(int *)(in_RDI + 0xd34) = *(int *)(in_RDI + 0xd34) + -1;
  }
  else {
    iVar3 = IdxSet::size((IdxSet *)(in_RDI + 0xc78));
    if ((iVar3 <= local_19c) && ((*(byte *)(in_RDI + 0xd29) & 1) == 0)) {
      if ((*(long *)(in_RDI + 0xda8) != 0) &&
         (VVar4 = SPxOut::getVerbosity(*(SPxOut **)(in_RDI + 0xda8)), 3 < (int)VVar4)) {
        local_29c = SPxOut::getVerbosity(*(SPxOut **)(in_RDI + 0xda8));
        local_2a0 = 4;
        (**(code **)(**(long **)(in_RDI + 0xda8) + 0x10))(*(long **)(in_RDI + 0xda8),&local_2a0);
        sVar6 = SPxOut::precision((SPxOut *)0x35e7c7);
        if ((*(byte *)(in_RDI + 0xd2c) & 1) == 0) {
          soplex::operator<<((SPxOut *)in_stack_fffffffffffffc90,
                             (char *)CONCAT44(in_stack_fffffffffffffc8c,in_stack_fffffffffffffc88));
        }
        else {
          soplex::operator<<((SPxOut *)in_stack_fffffffffffffc90,
                             (char *)CONCAT44(in_stack_fffffffffffffc8c,in_stack_fffffffffffffc88));
        }
        this_00 = (cpp_dec_float<50U,_int,_void> *)
                  soplex::operator<<((SPxOut *)in_stack_fffffffffffffc90,
                                     (char *)CONCAT44(in_stack_fffffffffffffc8c,
                                                      in_stack_fffffffffffffc88));
        std::setw(6);
        soplex::operator<<((SPxOut *)CONCAT44(in_stack_fffffffffffffc8c,in_stack_fffffffffffffc88),
                           (_Setw)(int)((ulong)this_00 >> 0x20));
        i_00 = soplex::operator<<((SPxOut *)this_00,
                                  (_func_ios_base_ptr_ios_base_ptr *)
                                  CONCAT44(in_stack_fffffffffffffc8c,in_stack_fffffffffffffc88));
        std::setprecision(4);
        this_01 = (cpp_dec_float<50U,_int,_void> *)
                  soplex::operator<<((SPxOut *)
                                     CONCAT44(in_stack_fffffffffffffc8c,in_stack_fffffffffffffc88),
                                     (_Setprecision)(int)((ulong)this_00 >> 0x20));
        local_324 = IdxSet::size((IdxSet *)(in_RDI + 0xc78));
        local_140 = &local_320;
        local_148 = &local_324;
        local_150 = 0;
        local_f8 = local_148;
        boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::cpp_dec_float<long_long>
                  (this_01,(longlong)i_00,this_00);
        local_328 = dim((SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                         *)0x35e8fd);
        local_28 = local_2e8;
        local_30 = &local_320;
        local_38 = &local_328;
        boost::multiprecision::detail::
        scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>,false>
        ::
        scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>>
                  (&local_39,local_30);
        local_20 = local_2e8;
        boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::cpp_dec_float(this_00);
        local_8 = local_2e8;
        local_10 = local_30;
        local_18 = local_38;
        local_48 = (long)*local_38;
        boost::multiprecision::default_ops::
        eval_divide<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,boost::multiprecision::backends::cpp_dec_float<50u,int,void>,long_long>
                  (this_00,(cpp_dec_float<50U,_int,_void> *)
                           CONCAT44(in_stack_fffffffffffffc8c,in_stack_fffffffffffffc88),
                   (longlong *)0x35e9bd);
        soplex::operator<<((SPxOut *)this_00,
                           (number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                            *)CONCAT44(in_stack_fffffffffffffc8c,in_stack_fffffffffffffc88));
        soplex::operator<<((SPxOut *)this_00,
                           (_func_ios_base_ptr_ios_base_ptr *)
                           CONCAT44(in_stack_fffffffffffffc8c,in_stack_fffffffffffffc88));
        std::setprecision((int)sVar6);
        soplex::operator<<((SPxOut *)CONCAT44(in_stack_fffffffffffffc8c,in_stack_fffffffffffffc88),
                           (_Setprecision)(int)((ulong)this_00 >> 0x20));
        soplex::operator<<((SPxOut *)this_00,
                           (_func_ostream_ptr_ostream_ptr *)
                           CONCAT44(in_stack_fffffffffffffc8c,in_stack_fffffffffffffc88));
        (**(code **)(**(long **)(in_RDI + 0xda8) + 0x10))(*(long **)(in_RDI + 0xda8),&local_29c);
      }
      *(undefined1 *)(in_RDI + 0xd29) = 1;
    }
  }
  return;
}

Assistant:

void SPxSolverBase<R>::computeCoTest()
{
   int i;
   R pricingTol = leavetol();
   m_pricingViolUpToDate = true;
   m_pricingViol = 0;
   m_numViol = 0;
   infeasibilities.clear();
   int sparsitythreshold = (int)(sparsePricingFactor * dim());
   const typename SPxBasisBase<R>::Desc& ds = this->desc();

   for(i = dim() - 1; i >= 0; --i)
   {
      typename SPxBasisBase<R>::Desc::Status stat = ds.coStatus(i);

      if(isBasic(stat))
      {
         theCoTest[i] = 0;

         if(remainingRoundsEnter == 0)
            isInfeasible[i] = SPxPricer<R>::NOT_VIOLATED;
      }
      else
      {
         theCoTest[i] = coTest(i, stat);

         if(remainingRoundsEnter == 0)
         {
            if(theCoTest[i] < -pricingTol)
            {
               assert(infeasibilities.size() < infeasibilities.max());
               m_pricingViol -= theCoTest[i];
               infeasibilities.addIdx(i);
               isInfeasible[i] = SPxPricer<R>::VIOLATED;
               ++m_numViol;
            }
            else
               isInfeasible[i] = SPxPricer<R>::NOT_VIOLATED;

            if(infeasibilities.size() > sparsitythreshold)
            {
               SPX_MSG_INFO2((*this->spxout), (*this->spxout) << " --- using dense pricing"
                             << std::endl;)
               remainingRoundsEnter = SOPLEX_DENSEROUNDS;
               sparsePricingEnter = false;
               infeasibilities.clear();
            }
         }
         else if(theCoTest[i] < -pricingTol)
         {
            m_pricingViol -= theCoTest[i];
            ++m_numViol;
         }
      }
   }

   if(infeasibilities.size() == 0 && !sparsePricingEnter)
      --remainingRoundsEnter;
   else if(infeasibilities.size() <= sparsitythreshold && !sparsePricingEnter)
   {
      SPX_MSG_INFO2((*this->spxout),
                    std::streamsize prec = spxout->precision();

                    if(hyperPricingEnter)
                    (*this->spxout) << " --- using hypersparse pricing, ";
                    else
                       (*this->spxout) << " --- using sparse pricing, ";
                       (*this->spxout) << "sparsity: "
                       << std::setw(6) << std::fixed << std::setprecision(4)
                       << (R) infeasibilities.size() / dim()
                       << std::scientific << std::setprecision(int(prec))
                       << std::endl;)
            sparsePricingEnter = true;
   }
}